

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

void repackIfAllDigits(char *input,int aonly)

{
  char cVar1;
  short sVar2;
  char *pcVar3;
  ushort uVar4;
  char *pcVar5;
  ushort uVar6;
  char *s;
  
  pcVar3 = input + -2;
  pcVar5 = (char *)0x0;
  do {
    cVar1 = pcVar3[2];
    if ((cVar1 == '\0') || (cVar1 == '-')) {
      if (pcVar5 < pcVar3 && pcVar5 != (char *)0x0) {
        if (aonly == 0) {
          uVar4 = (*pcVar3 * 10 + (short)pcVar3[1]) - 0x210;
          *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(long)((int)(short)uVar4 / 0x22) + 0x1f];
          uVar6 = (short)((int)(short)uVar4 / 0x22) * 0x22;
        }
        else {
          sVar2 = *pcVar3 * 10 + *input * 100;
          cVar1 = pcVar3[1];
          uVar4 = cVar1 + sVar2 + 0xeb30;
          *input = 'A';
          uVar6 = sVar2 + cVar1 + 0xeb4f;
          if (-1 < (short)uVar4) {
            uVar6 = uVar4;
          }
          *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(short)((uint)(int)(short)uVar6 >> 5)];
          uVar6 = uVar6 & 0xffe0;
        }
        pcVar3[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(short)(uVar4 - uVar6)];
      }
      return;
    }
    if ((byte)(cVar1 - 0x3aU) < 0xf6) {
      if (cVar1 != '.') {
        return;
      }
      if (pcVar5 != (char *)0x0) {
        return;
      }
      pcVar5 = pcVar3 + 2;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

static void repackIfAllDigits(char *input, const int aonly) {
    char *s = input;
    int alldigits = 1; // assume all digits
    char *e;
    char *dotpos = NULL;
    ASSERT(input);
    for (e = s; *e != 0 && *e != '-'; e++) {
        if (*e < '0' || *e > '9') {
            if (*e == '.' && !dotpos) {
                dotpos = e;
            } else {
                alldigits = 0;
                break;
            }
        }
    }
    e--;
    s = e - 1;
    if (alldigits && dotpos &&
        s > dotpos) // e is last char, s is one before, both are beyond dot, all characters are digits
    {
        if (aonly) // v1.50 - encode only using the letter A
        {
            const int v = ((*input) - '0') * 100 + ((*s) - '0') * 10 + ((*e) - '0');
            *input = 'A';
            *s = ENCODE_CHARS[v / 32];
            *e = ENCODE_CHARS[v % 32];
        } else // encode using A,E,U
        {
            const int v = ((*s) - '0') * 10 + ((*e) - '0');
            *s = ENCODE_CHARS[(v / 34) + 31];
            *e = ENCODE_CHARS[v % 34];
        }
    }
}